

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  byte *pbVar1;
  byte bVar2;
  WhereLoop *pTemplate;
  WhereInfo *pWInfo;
  SrcList *pSVar3;
  Table *pTVar4;
  WhereClause *pWC;
  WhereTerm *pWVar5;
  ExprList *pEVar6;
  WhereTerm *pTerm;
  bool bVar7;
  bool bVar8;
  u8 uVar9;
  u8 uVar10;
  LogEst LVar11;
  short sVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  u32 uVar16;
  int iVar17;
  ushort uVar18;
  Index *pIdx;
  ulong uVar19;
  ExprList_item *pEVar20;
  Expr *pA;
  WhereTerm *pWVar21;
  long lVar22;
  long lVar23;
  long in_FS_OFFSET;
  Bitmask m;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  Bitmask local_b8;
  i16 local_ae;
  uint local_ac;
  undefined1 local_a8 [88];
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_ac = 0xaaaaaaaa;
  local_ae = -1;
  pTemplate = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pSVar3 = pWInfo->pTabList;
  bVar2 = pTemplate->iTab;
  pTVar4 = pSVar3->a[bVar2].pSTab;
  if ((pSVar3->a[bVar2].fg.field_0x1 & 2) == 0) {
    if ((pTVar4->tabFlags & 0x80) == 0) {
      pIdx = (Index *)local_a8;
      puStack_40 = (undefined1 *)0x0;
      local_a8._0_8_ = (char *)0x0;
      local_a8._80_8_ = (ExprList *)0x0;
      local_a8._64_8_ = (char **)0x0;
      local_a8._72_8_ = (Expr *)0x0;
      local_a8._48_8_ = (Schema *)0x0;
      local_a8._56_8_ = (u8 *)0x0;
      local_a8._32_8_ = (char *)0x0;
      local_a8._40_8_ = (Index *)0x0;
      local_a8._8_8_ = &local_ae;
      local_a8._16_8_ = &local_ac;
      local_a8._24_8_ = pTVar4;
      puStack_50 = (undefined1 *)0x1000300000000;
      local_48 = (undefined1 *)0x3050001;
      local_ac = (uint)(ushort)pTVar4->nRowLogEst;
      if ((pSVar3->a[bVar2].fg.field_0x1 & 1) == 0) {
        local_a8._40_8_ = (pSVar3->a[bVar2].pSTab)->pIndex;
      }
    }
    else {
      pIdx = pTVar4->pIndex;
    }
  }
  else {
    pIdx = pSVar3->a[bVar2].u2.pIBIndex;
  }
  pWC = pBuilder->pWC;
  iVar17 = 0;
  iVar15 = 0;
  if ((((pBuilder->pOrSet == (WhereOrSet *)0x0) && ((pWInfo->wctrlFlags & 0x1020) == 0)) &&
      (iVar15 = iVar17, (pWInfo->pParse->db->flags & 0x8000) != 0)) &&
     (((pSVar3->a[bVar2].fg.field_0x1 & 0x93) == 0 && ((pSVar3->a[bVar2].fg.jointype & 0x10) == 0)))
     ) {
    uVar18 = pTVar4->nRowLogEst;
    pWVar5 = pWC->a;
    iVar17 = pWC->nTerm;
    iVar15 = 0;
    sVar12 = 0;
    if (10 < (short)uVar18) {
      LVar11 = sqlite3LogEst((ulong)uVar18);
      sVar12 = LVar11 + -0x21;
    }
    if (0 < iVar17) {
      pTerm = pWVar5;
      do {
        pWVar21 = pTerm + 1;
        iVar15 = 0;
        if ((pTerm->prereqRight & pTemplate->maskSelf) == 0) {
          iVar15 = 0;
          iVar14 = termCanDriveIndex(pTerm,pSVar3->a + bVar2,0);
          if (iVar14 != 0) {
            (pTemplate->u).btree.nEq = 1;
            (pTemplate->u).btree.pIndex = (Index *)0x0;
            pTemplate->nLTerm = 1;
            pTemplate->nSkip = 0;
            *pTemplate->aLTerm = pTerm;
            pTemplate->rSetup = sVar12 + uVar18;
            if ((pTVar4->eTabType == '\x02') ||
               (sVar13 = sVar12 + uVar18 + 0x1c, (pTVar4->tabFlags & 0x4000) != 0)) {
              sVar13 = sVar12 + uVar18 + -0x19;
            }
            LVar11 = 0;
            if (0 < sVar13) {
              LVar11 = sVar13;
            }
            pTemplate->rSetup = LVar11;
            pTemplate->nOut = 0x2b;
            LVar11 = sqlite3LogEstAdd(sVar12,0x2b);
            pTemplate->rRun = LVar11;
            pTemplate->wsFlags = 0x4000;
            pTemplate->prereq = pTerm->prereqRight | mPrereq;
            iVar15 = whereLoopInsert(pBuilder,pTemplate);
          }
        }
      } while ((iVar15 == 0) && (pTerm = pWVar21, pWVar21 < pWVar5 + iVar17));
    }
  }
  if ((iVar15 == 0) && (pIdx != (Index *)0x0)) {
    uVar9 = '\x01';
    do {
      if (((pIdx->pPartIdxWhere == (Expr *)0x0) ||
          (iVar15 = whereUsablePartialIndex
                              (pSVar3->a[bVar2].iCursor,pSVar3->a[bVar2].fg.jointype,pWC,
                               pIdx->pPartIdxWhere), iVar15 != 0)) && ((pIdx->field_0x64 & 2) == 0))
      {
        sVar12 = *pIdx->aiRowLogEst;
        (pTemplate->u).vtab.idxNum = 0;
        (pTemplate->u).btree.nTop = 0;
        pTemplate->nLTerm = 0;
        pTemplate->nSkip = 0;
        pTemplate->iSortIdx = '\0';
        pTemplate->rSetup = 0;
        pTemplate->prereq = mPrereq;
        pTemplate->nOut = sVar12;
        (pTemplate->u).btree.pIndex = pIdx;
        (pTemplate->u).btree.pOrderBy = (ExprList *)0x0;
        bVar8 = true;
        if ((((pIdx->field_0x63 & 4) == 0) &&
            (pEVar6 = pBuilder->pWInfo->pOrderBy, pEVar6 != (ExprList *)0x0)) && (0 < pEVar6->nExpr)
           ) {
          iVar15 = pSVar3->a[bVar2].iCursor;
          lVar22 = 0;
          do {
            pA = pEVar6->a[lVar22].pExpr;
            while ((pA != (Expr *)0x0 && ((pA->flags & 0x82000) != 0))) {
              if ((pA->flags >> 0x13 & 1) == 0) {
                if (pA->op != 'r') break;
                pEVar20 = (ExprList_item *)&pA->pLeft;
              }
              else {
                pEVar20 = ((pA->x).pList)->a;
              }
              pA = pEVar20->pExpr;
            }
            if (pA == (Expr *)0x0) {
              bVar7 = false;
            }
            else if (((pA->op | 2) == 0xaa) && (pA->iTable == iVar15)) {
              bVar7 = true;
              if (-1 < pA->iColumn) {
                if ((ulong)pIdx->nKeyCol != 0) {
                  uVar19 = 0;
                  do {
                    if (pA->iColumn == pIdx->aiColumn[uVar19]) goto LAB_0019c418;
                    uVar19 = uVar19 + 1;
                  } while (pIdx->nKeyCol != uVar19);
                }
                bVar7 = false;
              }
            }
            else {
              bVar7 = false;
              if ((pIdx->aColExpr != (ExprList *)0x0) && (pIdx->nKeyCol != 0)) {
                pEVar20 = pIdx->aColExpr->a;
                uVar19 = 0;
                do {
                  if ((pIdx->aiColumn[uVar19] == -2) &&
                     (iVar17 = sqlite3ExprCompareSkip(pA,pEVar20->pExpr,iVar15), iVar17 == 0)) {
                    bVar7 = true;
                    break;
                  }
                  uVar19 = uVar19 + 1;
                  pEVar20 = pEVar20 + 1;
                } while (uVar19 < pIdx->nKeyCol);
              }
            }
LAB_0019c418:
            if (bVar7) {
              bVar8 = false;
              break;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < pEVar6->nExpr);
        }
        if ((~*(ushort *)&pIdx->field_0x63 & 3) == 0) {
          uVar10 = uVar9;
          if (bVar8) {
            uVar10 = '\0';
          }
          pTemplate->wsFlags = 0x100;
          pTemplate->iSortIdx = uVar10;
          pTemplate->rRun = sVar12 + 0x10;
          whereLoopOutputAdjust(pWC,pTemplate,sVar12);
          uVar18 = *(ushort *)&pSVar3->a[bVar2].fg.field_0x1;
          if ((uVar18 & 4) != 0) {
            if ((uVar18 & 0x40) != 0) {
              pbVar1 = (byte *)((long)&pTemplate->wsFlags + 3);
              *pbVar1 = *pbVar1 | 2;
            }
            (pTemplate->u).btree.pOrderBy = (pSVar3->a[bVar2].u4.pSubq)->pSelect->pOrderBy;
          }
          iVar15 = whereLoopInsert(pBuilder,pTemplate);
          pTemplate->nOut = sVar12;
          if (iVar15 != 0) break;
        }
        else {
          if ((*(ushort *)&pIdx->field_0x63 & 0x20) == 0) {
            local_b8 = pIdx->colNotIdxed & pSVar3->a[bVar2].colUsed;
            if (pIdx->pPartIdxWhere != (Expr *)0x0) {
              wherePartIdxExpr(pWInfo->pParse,pIdx,pIdx->pPartIdxWhere,&local_b8,0,(SrcItem *)0x0);
            }
            pTemplate->wsFlags = 0x200;
            if ((((*(ushort *)&pIdx->field_0x63 >> 0xc & 1) == 0) || (local_b8 == 0)) ||
               ((*(ushort *)&pIdx->field_0x63 & 0x800) != 0)) {
              if ((local_b8 == 0) &&
                 ((((pTVar4->tabFlags & 0x80) == 0 || (pWInfo->pSelect != (Select *)0x0)) ||
                  ((sqlite3Config.xTestCallback != (_func_int_int *)0x0 &&
                   (iVar15 = (*sqlite3Config.xTestCallback)(700), iVar15 != 0))))))
              goto LAB_0019c56b;
            }
            else {
              uVar16 = whereIsCoveringIndex(pWInfo,pIdx,pSVar3->a[bVar2].iCursor);
              if (uVar16 != 0) {
                local_b8 = 0;
                pTemplate->wsFlags = pTemplate->wsFlags | uVar16;
              }
            }
          }
          else {
            local_b8 = 0;
LAB_0019c56b:
            pTemplate->wsFlags = 0x240;
          }
          uVar10 = uVar9;
          if (bVar8) {
            uVar10 = '\0';
            if ((((pTVar4->tabFlags & 0x80) != 0) || (pIdx->pPartIdxWhere != (Expr *)0x0)) ||
               ((uVar10 = '\0', (pSVar3->a[bVar2].fg.field_0x1 & 2) != 0 ||
                (((((local_b8 == 0 && ((pIdx->field_0x63 & 4) == 0)) &&
                   (pIdx->szIdxRow < pTVar4->szTabRow)) &&
                  (((pWInfo->wctrlFlags & 4) == 0 && (sqlite3Config.bUseCis != '\0')))) &&
                 ((pWInfo->pParse->db->dbOptFlags & 0x20) == 0)))))) goto LAB_0019c5ec;
LAB_0019c6fa:
            bVar8 = true;
            iVar15 = 0;
          }
          else {
LAB_0019c5ec:
            pTemplate->iSortIdx = uVar10;
            pTemplate->rRun = (short)((pIdx->szIdxRow * 0xf) / (int)pTVar4->szTabRow) + sVar12 + 1;
            if (local_b8 != 0) {
              sVar13 = sVar12 + 0x10;
              if (0 < (pWInfo->sWC).nTerm) {
                iVar15 = pSVar3->a[bVar2].iCursor;
                lVar23 = 0x14;
                lVar22 = 0;
                do {
                  pWVar5 = (pWInfo->sWC).a;
                  iVar17 = sqlite3ExprCoveredByIndex
                                     (*(Expr **)((long)pWVar5 + lVar23 + -0x14),iVar15,pIdx);
                  if (iVar17 != 0) {
                    uVar18 = *(ushort *)((long)pWVar5 + lVar23 + -4);
                    if (0 < (short)uVar18) {
                      uVar18 = -(ushort)((*(byte *)((long)&pWVar5->pExpr + lVar23) & 0x82) == 0) |
                               0xffec;
                    }
                    sVar13 = uVar18 + sVar13;
                  }
                  if (iVar17 == 0) break;
                  lVar22 = lVar22 + 1;
                  lVar23 = lVar23 + 0x38;
                } while (lVar22 < (pWInfo->sWC).nTerm);
              }
              LVar11 = sqlite3LogEstAdd(pTemplate->rRun,sVar13);
              pTemplate->rRun = LVar11;
            }
            whereLoopOutputAdjust(pWC,pTemplate,sVar12);
            if (((pSVar3->a[bVar2].fg.jointype & 0x10) == 0) ||
               (iVar15 = 0, pIdx->aColExpr == (ExprList *)0x0)) {
              iVar15 = whereLoopInsert(pBuilder,pTemplate);
            }
            pTemplate->nOut = sVar12;
            if (iVar15 == 0) goto LAB_0019c6fa;
            bVar8 = false;
          }
          if (!bVar8) break;
        }
        pBuilder->bldFlags1 = '\0';
        iVar15 = whereLoopAddBtreeIndex(pBuilder,pSVar3->a + bVar2,pIdx,0);
        if (pBuilder->bldFlags1 == '\x01') {
          pbVar1 = (byte *)((long)&pTVar4->tabFlags + 1);
          *pbVar1 = *pbVar1 | 1;
        }
      }
      else {
        iVar15 = 0;
      }
      if ((pSVar3->a[bVar2].fg.field_0x1 & 2) == 0) {
        pIdx = pIdx->pNext;
      }
      else {
        pIdx = (Index *)0x0;
      }
      if ((iVar15 != 0) || (uVar9 = uVar9 + '\x01', pIdx == (Index *)0x0)) break;
    } while( true );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar15;
  }
  __stack_chk_fail();
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequisites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  SrcItem *pSrc;              /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */

  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pSTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pSTab) );

  if( pSrc->fg.isIndexedBy ){
    assert( pSrc->fg.isCte==0 );
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->u2.pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = 3;  /* TUNING: Interior rows of IPK table are very small */
    sPk.idxType = SQLITE_IDXTYPE_IPK;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pSTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & (WHERE_RIGHT_JOIN|WHERE_OR_SUBCLAUSE))==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && !pSrc->fg.isIndexedBy  /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
   && (pSrc->fg.jointype & JT_RIGHT)==0 /* Not the right tab of a RIGHT JOIN */
  ){
    /* Generate auto-index WhereLoops */
    LogEst rLogSize;         /* Logarithm of the number of rows in the table */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    rLogSize = estLog(rSize);
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( !IsView(pTab) && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 25;  /* Greatly reduced setup cost for auto indexes
                               ** on ephemeral materializations of views */
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe;
      pProbe=(pSrc->fg.isIndexedBy ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pSrc->fg.jointype, pWC,
                                 pProbe->pPartIdxWhere)
    ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    pNew->u.btree.pOrderBy = 0;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);

    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is 3.0*N.  The 3.0 factor is an
      ** extra cost designed to discourage the use of full table scans,
      ** since index lookups have better worst-case performance if our
      ** stat guesses are wrong.  Reduce the 3.0 penalty slightly
      ** (to 2.75) if we have valid STAT4 information for the table.
      ** At 2.75, a full table scan is preferred over using an index on
      ** a column with just two distinct values where each value has about
      ** an equal number of appearances.  Without STAT4 data, we still want
      ** to use an index in that case, since the constraint might be for
      ** the scarcer of the two values, and in that case an index lookup is
      ** better.
      */
#ifdef SQLITE_ENABLE_STAT4
      pNew->rRun = rSize + 16 - 2*((pTab->tabFlags & TF_HasStat4)!=0);
#else
      pNew->rRun = rSize + 16;
#endif
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      if( pSrc->fg.isSubquery ){
        if( pSrc->fg.viaCoroutine ) pNew->wsFlags |= WHERE_COROUTINE;
        pNew->u.btree.pOrderBy = pSrc->u4.pSubq->pSelect->pOrderBy;
      }
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        m = 0;
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        if( pProbe->pPartIdxWhere ){
          wherePartIdxExpr(
              pWInfo->pParse, pProbe, pProbe->pPartIdxWhere, &m, 0, 0
          );
        }
        pNew->wsFlags = WHERE_INDEXED;
        if( m==TOPBIT || (pProbe->bHasExpr && !pProbe->bHasVCol && m!=0) ){
          u32 isCov = whereIsCoveringIndex(pWInfo, pProbe, pSrc->iCursor);
          if( isCov==0 ){
            WHERETRACE(0x200,
               ("-> %s is not a covering index"
                " according to whereIsCoveringIndex()\n", pProbe->zName));
            assert( m!=0 );
          }else{
            m = 0;
            pNew->wsFlags |= isCov;
            if( isCov & WHERE_IDX_ONLY ){
              WHERETRACE(0x200,
                 ("-> %s is a covering expression index"
                  " according to whereIsCoveringIndex()\n", pProbe->zName));
            }else{
              assert( isCov==WHERE_EXPRIDX );
              WHERETRACE(0x200,
                 ("-> %s might be a covering expression index"
                  " according to whereIsCoveringIndex()\n", pProbe->zName));
            }
          }
        }else if( m==0
           && (HasRowid(pTab) || pWInfo->pSelect!=0 || sqlite3FaultSim(700))
        ){
          WHERETRACE(0x200,
             ("-> %s a covering index according to bitmasks\n",
             pProbe->zName, m==0 ? "is" : "is not"));
          pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        }
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || pSrc->fg.isIndexedBy
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }

          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        if( (pSrc->fg.jointype & JT_RIGHT)!=0 && pProbe->aColExpr ){
          /* Do not do an SCAN of a index-on-expression in a RIGHT JOIN
          ** because the cursor used to access the index might not be
          ** positioned to the correct row during the right-join no-match
          ** loop. */
        }else{
          rc = whereLoopInsert(pBuilder, pNew);
        }
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags1 = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags1==SQLITE_BLDF1_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_MaybeReanalyze;
    }
#ifdef SQLITE_ENABLE_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}